

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

int secp256k1_scalar_add(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar1 = b->d[0];
  uVar2 = a->d[0];
  uVar3 = uVar1 + a->d[0];
  r->d[0] = uVar3;
  uVar6 = a->d[1];
  uVar2 = (ulong)CARRY8(uVar1,uVar2);
  uVar4 = uVar6 + uVar2;
  uVar1 = b->d[1];
  r->d[1] = uVar4 + uVar1;
  uVar13 = b->d[2] + a->d[2];
  uVar9 = (ulong)CARRY8(b->d[2],a->d[2]);
  uVar5 = uVar4 + uVar1;
  uVar6 = (ulong)CARRY8(uVar6,uVar2);
  uVar2 = uVar6 + uVar13;
  uVar11 = uVar2 + CARRY8(uVar4,uVar1);
  r->d[2] = uVar11;
  uVar14 = b->d[3] + a->d[3];
  uVar1 = (ulong)(CARRY8(uVar6,uVar13) || CARRY8(uVar2,(ulong)CARRY8(uVar4,uVar1)));
  uVar2 = uVar9 + uVar14;
  lVar10 = uVar2 + uVar1;
  bVar7 = (0xbaaedce6af48a03a < uVar5 && 0xfffffffffffffffd < uVar11) && lVar10 == -1;
  uVar8 = 0;
  if (0xbaaedce6af48a03b < uVar5) {
    uVar8 = (uint)bVar7;
  }
  uVar12 = 0;
  if (0xbfd25e8cd0364140 < uVar3) {
    uVar12 = (uint)bVar7;
  }
  uVar6 = (ulong)((uint)CARRY8(b->d[3],a->d[3]) +
                  (uVar12 | uVar8 | (uVar11 == 0xffffffffffffffff && lVar10 == -1)) +
                 (uint)(CARRY8(uVar9,uVar14) || CARRY8(uVar2,uVar1)));
  uVar1 = (ulong)CARRY8(uVar6 * 0x402da1732fc9bebf,uVar3);
  uVar2 = uVar6 * 0x4551231950b75fc4 + uVar5;
  r->d[0] = uVar6 * 0x402da1732fc9bebf + uVar3;
  r->d[1] = uVar2 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar6 * 0x4551231950b75fc4,uVar5) || CARRY8(uVar2,uVar1));
  r->d[2] = uVar11 + uVar6 + uVar1;
  r->d[3] = lVar10 + (ulong)(CARRY8(uVar11,uVar6) || CARRY8(uVar11 + uVar6,uVar1));
  return (int)uVar3;
}

Assistant:

static int secp256k1_scalar_add(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    int overflow;
    uint128_t t = (uint128_t)a->d[0] + b->d[0];
    r->d[0] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[1] + b->d[1];
    r->d[1] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[2] + b->d[2];
    r->d[2] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)a->d[3] + b->d[3];
    r->d[3] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    overflow = t + secp256k1_scalar_check_overflow(r);
    VERIFY_CHECK(overflow == 0 || overflow == 1);
    secp256k1_scalar_reduce(r, overflow);
    return overflow;
}